

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primecandidate.c
# Opt level: O2

mp_int * pcs_get_upper_bound(PrimeCandidateSource *pcs)

{
  mp_int *x;
  mp_int *r;
  
  x = mp_mul(pcs->limit,pcs->factor);
  r = mp_add(x,pcs->addend);
  mp_free(x);
  mp_sub_into(r,r,pcs->factor);
  return r;
}

Assistant:

mp_int *pcs_get_upper_bound(PrimeCandidateSource *pcs)
{
    /* Compute (limit-1) * factor + addend */
    mp_int *tmp = mp_mul(pcs->limit, pcs->factor);
    mp_int *bound = mp_add(tmp, pcs->addend);
    mp_free(tmp);
    mp_sub_into(bound, bound, pcs->factor);
    return bound;
}